

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-async-null-cb.c
# Opt level: O1

int run_test_async_null_cb(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  
  async_handle.queue[1]._0_4_ = 0xffffffff;
  async_handle.queue[1]._4_4_ = 0xffffffff;
  async_handle.pending = -1;
  async_handle._124_4_ = 0xffffffff;
  async_handle.async_cb._0_4_ = 0xffffffff;
  async_handle.async_cb._4_4_ = 0xffffffff;
  async_handle.queue[0]._0_4_ = 0xffffffff;
  async_handle.queue[0]._4_4_ = 0xffffffff;
  async_handle.next_closing._0_4_ = 0xffffffff;
  async_handle.next_closing._4_4_ = 0xffffffff;
  async_handle.flags = 0xffffffff;
  async_handle._92_4_ = 0xffffffff;
  async_handle.u._16_4_ = 0xffffffff;
  async_handle.u._20_4_ = 0xffffffff;
  async_handle.u._24_4_ = 0xffffffff;
  async_handle.u._28_4_ = 0xffffffff;
  async_handle.u.fd = -1;
  async_handle.u._4_4_ = 0xffffffff;
  async_handle.u._8_4_ = 0xffffffff;
  async_handle.u._12_4_ = 0xffffffff;
  async_handle.handle_queue[0]._0_4_ = 0xffffffff;
  async_handle.handle_queue[0]._4_4_ = 0xffffffff;
  async_handle.handle_queue[1]._0_4_ = 0xffffffff;
  async_handle.handle_queue[1]._4_4_ = 0xffffffff;
  async_handle.type = ~UV_UNKNOWN_HANDLE;
  async_handle._20_4_ = 0xffffffff;
  async_handle.close_cb._0_4_ = 0xffffffff;
  async_handle.close_cb._4_4_ = 0xffffffff;
  async_handle.data._0_4_ = 0xffffffff;
  async_handle.data._4_4_ = 0xffffffff;
  async_handle.loop._0_4_ = 0xffffffff;
  async_handle.loop._4_4_ = 0xffffffff;
  puVar2 = uv_default_loop();
  iVar1 = uv_async_init(puVar2,&async_handle,(uv_async_cb)0x0);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_check_init(puVar2,&check_handle);
    if (iVar1 != 0) goto LAB_00149a3b;
    iVar1 = uv_check_start(&check_handle,check_cb);
    if (iVar1 != 0) goto LAB_00149a40;
    iVar1 = uv_thread_create(&thread,thread_cb,(void *)0x0);
    if (iVar1 != 0) goto LAB_00149a45;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00149a4a;
    iVar1 = uv_thread_join(&thread);
    if (iVar1 != 0) goto LAB_00149a4f;
    if (check_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00149a59;
    }
  }
  else {
    run_test_async_null_cb_cold_1();
LAB_00149a3b:
    run_test_async_null_cb_cold_2();
LAB_00149a40:
    run_test_async_null_cb_cold_3();
LAB_00149a45:
    run_test_async_null_cb_cold_4();
LAB_00149a4a:
    run_test_async_null_cb_cold_5();
LAB_00149a4f:
    run_test_async_null_cb_cold_6();
  }
  run_test_async_null_cb_cold_7();
LAB_00149a59:
  run_test_async_null_cb_cold_8();
  if (check_cb_called == 0) {
    uv_close((uv_handle_t *)&async_handle,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&check_handle,(uv_close_cb)0x0);
    check_cb_called = check_cb_called + 1;
    return extraout_EAX;
  }
  check_cb_cold_1();
  iVar1 = uv_async_send(&async_handle);
  return iVar1;
}

Assistant:

TEST_IMPL(async_null_cb) {
  /*
   * Fill async_handle with garbage values.
   * uv_async_init() should properly initialize struct fields regardless of
   * initial values.
   * This is added to verify paddings between fields do not affect behavior.
   */
  memset(&async_handle, 0xff, sizeof(async_handle));

  ASSERT(0 == uv_async_init(uv_default_loop(), &async_handle, NULL));
  ASSERT(0 == uv_check_init(uv_default_loop(), &check_handle));
  ASSERT(0 == uv_check_start(&check_handle, check_cb));
  ASSERT(0 == uv_thread_create(&thread, thread_cb, NULL));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == uv_thread_join(&thread));
  ASSERT(1 == check_cb_called);
  MAKE_VALGRIND_HAPPY();
  return 0;
}